

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_second_step1.cpp
# Opt level: O0

bool __thiscall
ruckig::PositionSecondOrderStep1::get_profile
          (PositionSecondOrderStep1 *this,Profile *input,Block *block)

{
  double left;
  Profile *block_00;
  bool bVar1;
  reference pvVar2;
  iterator this_00;
  size_t valid_profile_counter;
  array<double,_7UL> *this_01;
  double extraout_XMM0_Qa;
  double right;
  double extraout_XMM0_Qa_00;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double aMin;
  double aMax;
  double vMin;
  double vMax;
  ProfileIter profile;
  ProfileIter start;
  Block *local_30;
  Profile *p;
  Block *block_local;
  Profile *input_local;
  PositionSecondOrderStep1 *this_local;
  
  p = &block->p_min;
  block_local = (Block *)input;
  input_local = (Profile *)this;
  if ((((this->_vMax != 0.0) || (NAN(this->_vMax))) || (this->_vMin != 0.0)) || (NAN(this->_vMin)))
  {
    this_00 = std::array<ruckig::Profile,_3UL>::begin(&this->valid_profiles);
    vMax = (double)this_00;
    profile = this_00;
    Profile::set_boundary(this_00,&block_local->p_min);
    std::abs((int)this_00);
    if (2.220446049250313e-16 <= extraout_XMM0_Qa_00) {
      time_none(this,(ProfileIter *)&vMax,this->_vMax,this->_vMin,this->_aMax,this->_aMin,false);
      time_none(this,(ProfileIter *)&vMax,this->_vMin,this->_vMax,this->_aMin,this->_aMax,false);
      time_acc0(this,(ProfileIter *)&vMax,this->_vMax,this->_vMin,this->_aMax,this->_aMin,false);
      time_acc0(this,(ProfileIter *)&vMax,this->_vMin,this->_vMax,this->_aMin,this->_aMax,false);
    }
    else {
      if (this->pd < 0.0) {
        local_2c8 = this->_vMin;
      }
      else {
        local_2c8 = this->_vMax;
      }
      if (this->pd < 0.0) {
        local_2d0 = this->_vMax;
      }
      else {
        local_2d0 = this->_vMin;
      }
      if (this->pd < 0.0) {
        local_2d8 = this->_aMin;
      }
      else {
        local_2d8 = this->_aMax;
      }
      if (this->pd < 0.0) {
        local_2e0 = this->_aMax;
      }
      else {
        local_2e0 = this->_aMin;
      }
      time_none(this,(ProfileIter *)&vMax,local_2c8,local_2d0,local_2d8,local_2e0,true);
      if ((((ulong)vMax <= profile) &&
          (time_acc0(this,(ProfileIter *)&vMax,local_2c8,local_2d0,local_2d8,local_2e0,true),
          (ulong)vMax <= profile)) &&
         (time_none(this,(ProfileIter *)&vMax,local_2d0,local_2c8,local_2e0,local_2d8,true),
         (ulong)vMax <= profile)) {
        time_acc0(this,(ProfileIter *)&vMax,local_2d0,local_2c8,local_2e0,local_2d8,true);
      }
    }
    block_00 = p;
    valid_profile_counter = std::distance<ruckig::Profile*>(profile,(Profile *)vMax);
    this_local._7_1_ =
         Block::calculate_block<3ul,true>
                   ((Block *)block_00,&this->valid_profiles,valid_profile_counter);
  }
  else {
    local_30 = block;
    Profile::set_boundary(&block->p_min,input);
    bVar1 = time_all_single_step
                      (this,&local_30->p_min,this->_vMax,this->_vMin,this->_aMax,this->_aMin);
    if (bVar1) {
      this_01 = &(local_30->p_min).t_sum;
      pvVar2 = std::array<double,_7UL>::back(this_01);
      p[1].t._M_elems[0] =
           *pvVar2 + (local_30->p_min).brake.duration + (local_30->p_min).accel.duration;
      std::abs((int)this_01);
      if (2.220446049250313e-16 < extraout_XMM0_Qa) {
        left = p[1].t._M_elems[0];
        right = std::numeric_limits<double>::infinity();
        Block::Interval::Interval((Interval *)&start,left,right);
        std::optional<ruckig::Block::Interval>::operator=
                  ((optional<ruckig::Block::Interval> *)(p[1].t._M_elems + 1),(Interval *)&start);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool PositionSecondOrderStep1::get_profile(const Profile& input, Block& block) {
    // Zero-limits special case
    if (_vMax == 0.0 && _vMin == 0.0) {
        auto& p = block.p_min;
        p.set_boundary(input);

        if (time_all_single_step(&p, _vMax, _vMin, _aMax, _aMin)) {
            block.t_min = p.t_sum.back() + p.brake.duration + p.accel.duration;
            if (std::abs(v0) > DBL_EPSILON) {
                block.a = Block::Interval(block.t_min, std::numeric_limits<double>::infinity());
            }
            return true;
        }
        return false;
    }

    const ProfileIter start = valid_profiles.begin();
    ProfileIter profile = start;
    profile->set_boundary(input);

    if (std::abs(vf) < DBL_EPSILON) {
        // There is no blocked interval when vf==0, so return after first found profile
        const double vMax = (pd >= 0) ? _vMax : _vMin;
        const double vMin = (pd >= 0) ? _vMin : _vMax;
        const double aMax = (pd >= 0) ? _aMax : _aMin;
        const double aMin = (pd >= 0) ? _aMin : _aMax;

        time_none(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }

        time_none(profile, vMin, vMax, aMin, aMax, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMin, vMax, aMin, aMax, true);

    } else {
        time_none(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_none(profile, _vMin, _vMax, _aMin, _aMax, false);
        time_acc0(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_acc0(profile, _vMin, _vMax, _aMin, _aMax, false);
    }

return_block:
    return Block::calculate_block(block, valid_profiles, std::distance(start, profile));
}